

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::saveOutput(FastText *this,string *filename)

{
  byte bVar1;
  invalid_argument *piVar2;
  element_type *peVar3;
  element_type *peVar4;
  ostream *os;
  Dictionary *this_00;
  Vector *this_01;
  ostream *poVar5;
  string *in_RSI;
  long in_RDI;
  string word;
  int32_t i;
  Vector vec;
  int32_t n;
  ofstream ofs;
  int64_t in_stack_fffffffffffffd18;
  ostream *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  int local_2b0;
  string local_280 [36];
  int lid;
  Dictionary *in_stack_fffffffffffffda8;
  string local_240 [48];
  ostream local_210 [528];
  
  std::ofstream::ofstream(local_210,in_RSI,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   in_stack_fffffffffffffd40);
    std::invalid_argument::invalid_argument(piVar2,local_240);
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((*(byte *)(in_RDI + 0x68) & 1) != 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar2,"Option -saveOutput is not supported for quantized models.");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b8f72);
  if (peVar3->model == sup) {
    peVar4 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b8f89);
    local_2b0 = Dictionary::nlabels(peVar4);
  }
  else {
    peVar4 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b8faf);
    local_2b0 = Dictionary::nwords(peVar4);
  }
  os = (ostream *)std::ostream::operator<<(local_210,local_2b0);
  this_00 = (Dictionary *)std::operator<<(os," ");
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b900f);
  this_01 = (Vector *)std::ostream::operator<<(this_00,peVar3->dim);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b9043);
  Vector::Vector((Vector *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  for (lid = 0; lid < local_2b0; lid = lid + 1) {
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b9082);
    if (peVar3->model == sup) {
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1b9099);
      Dictionary::getLabel_abi_cxx11_(in_stack_fffffffffffffda8,lid);
    }
    else {
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1b90bf);
      Dictionary::getWord_abi_cxx11_(this_00,(int32_t)((ulong)this_01 >> 0x20));
    }
    Vector::zero(this_01);
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffd20);
    Vector::addRow((Vector *)os,(Matrix *)this_00,(int64_t)this_01);
    poVar5 = std::operator<<(local_210,local_280);
    in_stack_fffffffffffffd20 = std::operator<<(poVar5," ");
    poVar5 = operator<<(os,(Vector *)this_00);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_280);
  }
  std::ofstream::close();
  Vector::~Vector((Vector *)0x1b91db);
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void FastText::saveOutput(const std::string& filename) {
  std::ofstream ofs(filename);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        filename + " cannot be opened for saving vectors!");
  }
  if (quant_) {
    throw std::invalid_argument(
        "Option -saveOutput is not supported for quantized models.");
  }
  int32_t n =
      (args_->model == model_name::sup) ? dict_->nlabels() : dict_->nwords();
  ofs << n << " " << args_->dim << std::endl;
  Vector vec(args_->dim);
  for (int32_t i = 0; i < n; i++) {
    std::string word = (args_->model == model_name::sup) ? dict_->getLabel(i)
                                                         : dict_->getWord(i);
    vec.zero();
    vec.addRow(*output_, i);
    ofs << word << " " << vec << std::endl;
  }
  ofs.close();
}